

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetTimerFuncEx(uint id,uint millis,gpioTimerFuncEx_t f,void *userdata)

{
  FILE *pFVar1;
  char *pcVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uint in_ESI;
  uint in_EDI;
  void *in_stack_00000020;
  int in_stack_0000002c;
  void *in_stack_00000030;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: id=%d millis=%d function=%08X, userdata=%08X\n",pcVar2,
            "gpioSetTimerFuncEx",(ulong)in_EDI,(ulong)in_ESI,in_EDX,in_ECX);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,
              "gpioSetTimerFuncEx");
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 10) {
    if ((in_ESI < 10) || (60000 < in_ESI)) {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: timer %d, bad millis (%d)\n",pcVar2,"gpioSetTimerFuncEx",
                (ulong)in_EDI,(ulong)in_ESI);
      }
      local_4 = -10;
    }
    else {
      intGpioSetTimerFunc((uint)f,userdata._4_4_,in_stack_00000030,in_stack_0000002c,
                          in_stack_00000020);
      local_4 = 0;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad timer id (%d)\n",pcVar2,"gpioSetTimerFuncEx",(ulong)in_EDI);
    }
    local_4 = -9;
  }
  return local_4;
}

Assistant:

int gpioSetTimerFuncEx(unsigned id, unsigned millis, gpioTimerFuncEx_t f,
                       void * userdata)
{
   DBG(DBG_USER, "id=%d millis=%d function=%08X, userdata=%08X",
      id, millis, (uint32_t)f, (uint32_t)userdata);

   CHECK_INITED;

   if (id > PI_MAX_TIMER)
      SOFT_ERROR(PI_BAD_TIMER, "bad timer id (%d)", id);

   if ((millis < PI_MIN_MS) || (millis > PI_MAX_MS))
      SOFT_ERROR(PI_BAD_MS, "timer %d, bad millis (%d)", id, millis);

   intGpioSetTimerFunc(id, millis, f, 1, userdata);

   return 0;
}